

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlnode.cpp
# Opt level: O0

bool __thiscall libcellml::XmlNode::isInteger(XmlNode *this)

{
  bool bVar1;
  string local_38;
  int local_14;
  XmlNode *pXStack_10;
  int dummyInt;
  XmlNode *this_local;
  
  pXStack_10 = this;
  convertToStrippedString_abi_cxx11_(&local_38,this);
  bVar1 = convertToInt(&local_38,&local_14);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

bool XmlNode::isInteger() const
{
    int dummyInt;
    return convertToInt(convertToStrippedString(), dummyInt);
}